

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_intersect(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  void **ppvVar6;
  bool bVar7;
  bool bVar8;
  undefined1 uVar9;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  long *plVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  
  uVar10 = 0;
  uVar16 = 0;
LAB_0011cc54:
  do {
    uVar19 = uVar16;
    uVar18 = uVar10;
    bVar7 = (int)uVar18 < (x1->high_low_container).size;
    bVar8 = (int)uVar19 < (x2->high_low_container).size;
    if (!bVar8 || !bVar7) {
      return bVar8 && bVar7;
    }
    puVar4 = (x1->high_low_container).keys;
    uVar10 = uVar18 & 0xffff;
    uVar1 = puVar4[uVar10];
    puVar5 = (x2->high_low_container).keys;
    uVar16 = uVar19 & 0xffff;
    uVar2 = puVar5[uVar16];
    if (uVar1 == uVar2) {
      bVar11 = (x1->high_low_container).typecodes[uVar10];
      if (bVar11 == 4) {
        bVar11 = *(byte *)((long)(x1->high_low_container).containers[uVar10] + 8);
      }
      ppvVar6 = (x2->high_low_container).containers;
      bVar12 = (x2->high_low_container).typecodes[uVar16];
      plVar15 = (long *)ppvVar6[uVar16];
      if (bVar12 == 4) {
        bVar12 = *(byte *)(plVar15 + 1);
        plVar15 = (long *)*plVar15;
      }
      uVar9 = (*(code *)(&DAT_00138ea4 +
                        *(int *)(&DAT_00138ea4 + (ulong)(((uint)bVar12 + (uint)bVar11 * 4) - 5) * 4)
                        ))(ppvVar6,plVar15,&DAT_00138ea4,
                           &DAT_00138ea4 +
                           *(int *)(&DAT_00138ea4 +
                                   (ulong)(((uint)bVar12 + (uint)bVar11 * 4) - 5) * 4));
      return (_Bool)uVar9;
    }
    if (uVar1 < uVar2) {
      uVar3 = (x1->high_low_container).size;
      uVar14 = uVar18 + 1;
      uVar10 = uVar14;
      uVar16 = uVar19;
      if (((int)uVar14 < (int)uVar3) && (puVar4[(int)uVar14] < uVar2)) {
        uVar18 = uVar18 + 2;
        iVar17 = 1;
        if ((int)uVar18 < (int)uVar3) {
          iVar13 = 1;
          do {
            iVar17 = iVar13;
            if (uVar2 <= puVar4[(int)uVar18]) goto LAB_0011cd4c;
            iVar17 = iVar13 * 2;
            uVar18 = uVar14 + iVar13 * 2;
            iVar13 = iVar17;
          } while ((int)uVar18 < (int)uVar3);
        }
        uVar18 = uVar3 - 1;
LAB_0011cd4c:
        uVar10 = uVar18;
        if (((puVar4[(int)uVar18] != uVar2) && (uVar10 = uVar3, uVar2 <= puVar4[(int)uVar18])) &&
           (uVar10 = uVar18, (iVar17 >> 1) + uVar14 + 1 != uVar18)) {
          uVar14 = (iVar17 >> 1) + uVar14;
          do {
            uVar10 = (int)(uVar14 + uVar18) >> 1;
            if (puVar4[(int)uVar10] == uVar2) break;
            if (uVar2 <= puVar4[(int)uVar10]) {
              uVar18 = uVar10;
              uVar10 = uVar14;
            }
            uVar14 = uVar10;
            uVar10 = uVar18;
          } while (uVar14 + 1 != uVar18);
        }
      }
      goto LAB_0011cc54;
    }
    uVar3 = (x2->high_low_container).size;
    uVar14 = uVar19 + 1;
    uVar10 = uVar18;
    uVar16 = uVar14;
    if (((int)uVar14 < (int)uVar3) && (puVar5[(int)uVar14] < uVar1)) {
      uVar19 = uVar19 + 2;
      iVar17 = 1;
      if ((int)uVar19 < (int)uVar3) {
        iVar13 = 1;
        do {
          iVar17 = iVar13;
          if (uVar1 <= puVar5[(int)uVar19]) goto LAB_0011cdbd;
          iVar17 = iVar13 * 2;
          uVar19 = uVar14 + iVar13 * 2;
          iVar13 = iVar17;
        } while ((int)uVar19 < (int)uVar3);
      }
      uVar19 = uVar3 - 1;
LAB_0011cdbd:
      uVar16 = uVar19;
      if (((puVar5[(int)uVar19] != uVar1) && (uVar16 = uVar3, uVar1 <= puVar5[(int)uVar19])) &&
         (uVar16 = uVar19, (iVar17 >> 1) + uVar14 + 1 != uVar19)) {
        uVar14 = (iVar17 >> 1) + uVar14;
        do {
          uVar16 = (int)(uVar14 + uVar19) >> 1;
          if (puVar5[(int)uVar16] == uVar1) break;
          if (uVar1 <= puVar5[(int)uVar16]) {
            uVar19 = uVar16;
            uVar16 = uVar14;
          }
          uVar14 = uVar16;
          uVar16 = uVar19;
        } while (uVar14 + 1 != uVar19);
      }
    }
  } while( true );
}

Assistant:

bool roaring_bitmap_intersect(const roaring_bitmap_t *x1,
                              const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            if (container_intersect(c1, type1, c2, type2)) return true;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer != 0;
}